

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RsRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsRuleSyntax,slang::syntax::RandJoinClauseSyntax*&,slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>const&,slang::syntax::RsWeightClauseSyntax*&>
          (BumpAllocator *this,RandJoinClauseSyntax **args,
          SyntaxList<slang::syntax::RsProdSyntax> *args_1,RsWeightClauseSyntax **args_2)

{
  RsRuleSyntax *this_00;
  
  this_00 = (RsRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsRuleSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (RsRuleSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::RsRuleSyntax::RsRuleSyntax(this_00,*args,args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }